

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O2

float __thiscall testgen::_bigrecord_Union__0__::get_float(_bigrecord_Union__0__ *this)

{
  Exception *this_00;
  float fVar1;
  allocator<char> local_39;
  string local_38;
  
  if (this->idx_ == 2) {
    fVar1 = boost::any_cast<float>(&this->value_);
    return fVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid type for union",&local_39);
  avro::Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
float _bigrecord_Union__0__::get_float() const {
    if (idx_ != 2) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<float >(value_);
}